

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::Data
          (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *this,
          Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *other)

{
  uchar *puVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Connection CVar4;
  anon_struct_40_1_898a9ca8_for_storage *paVar5;
  ulong uVar6;
  Node<unsigned_long_long,_QSslServerPrivate::SocketData> *pNVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  R RVar11;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar9 = other->numBuckets;
  sVar10 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar10;
  this->spans = (Span *)0x0;
  RVar11 = allocateSpans(sVar9);
  this->spans = RVar11.spans;
  if (RVar11.nSpans != 0) {
    lVar8 = 0;
    sVar9 = 0;
    do {
      pSVar2 = other->spans;
      sVar10 = 0;
      do {
        uVar6 = (ulong)pSVar2->offsets[sVar10 + lVar8];
        if (uVar6 != 0xff) {
          pEVar3 = pSVar2[sVar9].entries;
          pNVar7 = Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::
                   insert(this->spans + sVar9,sVar10);
          paVar5 = &pEVar3[uVar6].storage;
          pNVar7->key = *(unsigned_long_long *)paVar5->data;
          QMetaObject::Connection::Connection
                    (&(pNVar7->value).readyReadConnection,(Connection *)(paVar5->data + 8));
          puVar1 = pEVar3[uVar6].storage.data + 0x10;
          QMetaObject::Connection::Connection
                    (&(pNVar7->value).destroyedConnection,(Connection *)puVar1);
          (pNVar7->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)*(void **)(puVar1 + 8);
          CVar4.d_ptr = *(void **)(puVar1 + 0x10);
          (pNVar7->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar4.d_ptr;
          if (CVar4.d_ptr != (void *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)CVar4.d_ptr + 8) = *(int *)((long)CVar4.d_ptr + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)CVar4.d_ptr + 8) = *(int *)((long)CVar4.d_ptr + 8) + 1;
            }
          }
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != 0x80);
      sVar9 = sVar9 + 1;
      lVar8 = lVar8 + 0x90;
    } while (sVar9 != RVar11.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }